

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O0

void setter_thread_body(void *arg)

{
  int iVar1;
  int local_14;
  int i;
  void *arg_local;
  
  local_14 = 0;
  while( true ) {
    if (0x31 < local_14) {
      return;
    }
    iVar1 = uv_set_process_title(titles[0]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,0x3d,"0 == uv_set_process_title(titles[0])");
      abort();
    }
    iVar1 = uv_set_process_title(titles[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,0x3e,"0 == uv_set_process_title(titles[1])");
      abort();
    }
    iVar1 = uv_set_process_title(titles[2]);
    if (iVar1 != 0) break;
    iVar1 = uv_set_process_title(titles[3]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,0x40,"0 == uv_set_process_title(titles[3])");
      abort();
    }
    local_14 = local_14 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
          ,0x3f,"0 == uv_set_process_title(titles[2])");
  abort();
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT(0 == uv_set_process_title(titles[0]));
    ASSERT(0 == uv_set_process_title(titles[1]));
    ASSERT(0 == uv_set_process_title(titles[2]));
    ASSERT(0 == uv_set_process_title(titles[3]));
  }
}